

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldLiteGenerator::GenerateMembers
          (ImmutableMapFieldLiteGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  JavaType JVar1;
  FieldDescriptor *pFVar2;
  char *pcVar3;
  char *text;
  char *text_00;
  char *text_01;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,
                     "private static final class $capitalized_name$DefaultEntryHolder {\n  static final com.google.protobuf.MapEntryLite<\n      $type_parameters$> defaultEntry =\n          com.google.protobuf.MapEntryLite\n          .<$type_parameters$>newDefaultInstance(\n              $key_wire_type$,\n              $key_default_value$,\n              $value_wire_type$,\n              $value_default_value$);\n}\n"
                    );
  io::Printer::Print(printer,variables,
                     "private com.google.protobuf.MapFieldLite<\n    $type_parameters$> $name$_ =\n        com.google.protobuf.MapFieldLite.emptyMapField();\nprivate com.google.protobuf.MapFieldLite<$type_parameters$>\ninternalGet$capitalized_name$() {\n  return $name$_;\n}\nprivate com.google.protobuf.MapFieldLite<$type_parameters$>\ninternalGetMutable$capitalized_name$() {\n  if (!$name$_.isMutable()) {\n    $name$_ = $name$_.mutableCopy();\n  }\n  return $name$_;\n}\n"
                    );
  io::Printer::Print(printer,variables,
                     "$deprecation$\npublic int get$capitalized_name$Count() {\n  return internalGet$capitalized_name$().size();\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$\npublic boolean contains$capitalized_name$(\n    $key_type$ key) {\n  $key_null_check$\n  return internalGet$capitalized_name$().containsKey(key);\n}\n"
                    );
  pFVar2 = anon_unknown_1::ValueField(this->descriptor_);
  JVar1 = GetJavaType(pFVar2);
  if (JVar1 == JAVATYPE_ENUM) {
    io::Printer::Print(printer,variables,
                       "private static final\ncom.google.protobuf.Internal.MapAdapter.Converter<\n    java.lang.Integer, $value_enum_type$> $name$ValueConverter =\n        com.google.protobuf.Internal.MapAdapter.newEnumConverter(\n            $value_enum_type$.internalGetValueMap(),\n            $unrecognized_value$);\n"
                      );
    io::Printer::Print(printer,variables,
                       "/**\n * Use {@link #get$capitalized_name$Map()} instead.\n */\n@java.lang.Deprecated\npublic java.util.Map<$boxed_key_type$, $value_enum_type$>\nget$capitalized_name$() {\n  return get$capitalized_name$Map();\n}\n"
                      );
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,variables,
                       "$deprecation$\npublic java.util.Map<$boxed_key_type$, $value_enum_type$>\nget$capitalized_name$Map() {\n  return java.util.Collections.unmodifiableMap(\n      new com.google.protobuf.Internal.MapAdapter<\n        $boxed_key_type$, $value_enum_type$, java.lang.Integer>(\n            internalGet$capitalized_name$(),\n            $name$ValueConverter));\n}\n"
                      );
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,variables,
                       "$deprecation$\npublic $value_enum_type$ get$capitalized_name$OrDefault(\n    $key_type$ key,\n    $value_enum_type$ defaultValue) {\n  $key_null_check$\n  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n      internalGet$capitalized_name$();\n  return map.containsKey(key)\n         ? $name$ValueConverter.doForward(map.get(key))\n         : defaultValue;\n}\n"
                      );
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,variables,
                       "$deprecation$\npublic $value_enum_type$ get$capitalized_name$OrThrow(\n    $key_type$ key) {\n  $key_null_check$\n  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n      internalGet$capitalized_name$();\n  if (!map.containsKey(key)) {\n    throw new java.lang.IllegalArgumentException();\n  }\n  return $name$ValueConverter.doForward(map.get(key));\n}\n"
                      );
    if (*(int *)(*(long *)(this->descriptor_ + 0x30) + 0x8c) != 3) goto LAB_0029ac9b;
    text_00 = 
    "$deprecation$\npublic $value_type$ get$capitalized_name$ValueOrThrow(\n    $key_type$ key) {\n  $key_null_check$\n  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n      internalGet$capitalized_name$();\n  if (!map.containsKey(key)) {\n    throw new java.lang.IllegalArgumentException();\n  }\n  return map.get(key);\n}\n"
    ;
    text_01 = 
    "$deprecation$\npublic $value_type$ get$capitalized_name$ValueOrDefault(\n    $key_type$ key,\n    $value_type$ defaultValue) {\n  $key_null_check$\n  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n      internalGet$capitalized_name$();\n  return map.containsKey(key) ? map.get(key) : defaultValue;\n}\n"
    ;
    text = 
    "$deprecation$\npublic java.util.Map<$boxed_key_type$, $boxed_value_type$>\nget$capitalized_name$ValueMap() {\n  return java.util.Collections.unmodifiableMap(\n      internalGet$capitalized_name$());\n}\n"
    ;
    pcVar3 = 
    "/**\n * Use {@link #get$capitalized_name$ValueMap()} instead.\n */\n@java.lang.Deprecated\npublic java.util.Map<$boxed_key_type$, $boxed_value_type$>\nget$capitalized_name$Value() {\n  return get$capitalized_name$ValueMap();\n}\n"
    ;
  }
  else {
    text_00 = 
    "$deprecation$\npublic $value_type$ get$capitalized_name$OrThrow(\n    $key_type$ key) {\n  $key_null_check$\n  java.util.Map<$type_parameters$> map =\n      internalGet$capitalized_name$();\n  if (!map.containsKey(key)) {\n    throw new java.lang.IllegalArgumentException();\n  }\n  return map.get(key);\n}\n"
    ;
    text_01 = 
    "$deprecation$\npublic $value_type$ get$capitalized_name$OrDefault(\n    $key_type$ key,\n    $value_type$ defaultValue) {\n  $key_null_check$\n  java.util.Map<$type_parameters$> map =\n      internalGet$capitalized_name$();\n  return map.containsKey(key) ? map.get(key) : defaultValue;\n}\n"
    ;
    text = 
    "$deprecation$\npublic java.util.Map<$type_parameters$> get$capitalized_name$Map() {\n  return java.util.Collections.unmodifiableMap(\n      internalGet$capitalized_name$());\n}\n"
    ;
    pcVar3 = 
    "/**\n * Use {@link #get$capitalized_name$Map()} instead.\n */\n@java.lang.Deprecated\npublic java.util.Map<$type_parameters$> get$capitalized_name$() {\n  return get$capitalized_name$Map();\n}\n"
    ;
  }
  io::Printer::Print(printer,variables,pcVar3);
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,text);
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,text_01);
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,text_00);
LAB_0029ac9b:
  pFVar2 = anon_unknown_1::ValueField(this->descriptor_);
  JVar1 = GetJavaType(pFVar2);
  pFVar2 = this->descriptor_;
  if (JVar1 == JAVATYPE_ENUM) {
    WriteFieldDocComment(printer,pFVar2);
    io::Printer::Print(printer,variables,
                       "private java.util.Map<$boxed_key_type$, $value_enum_type$>\ngetMutable$capitalized_name$Map() {\n  return new com.google.protobuf.Internal.MapAdapter<\n      $boxed_key_type$, $value_enum_type$, java.lang.Integer>(\n          internalGetMutable$capitalized_name$(),\n          $name$ValueConverter);\n}\n"
                      );
    pFVar2 = this->descriptor_;
    if (*(int *)(*(long *)(pFVar2 + 0x30) + 0x8c) != 3) {
      return;
    }
    pcVar3 = 
    "private java.util.Map<$boxed_key_type$, $boxed_value_type$>\ngetMutable$capitalized_name$ValueMap() {\n  return internalGetMutable$capitalized_name$();\n}\n"
    ;
  }
  else {
    pcVar3 = 
    "private java.util.Map<$type_parameters$>\ngetMutable$capitalized_name$Map() {\n  return internalGetMutable$capitalized_name$();\n}\n"
    ;
  }
  WriteFieldDocComment(printer,pFVar2);
  io::Printer::Print(printer,variables,pcVar3);
  return;
}

Assistant:

void ImmutableMapFieldLiteGenerator::
GenerateMembers(io::Printer* printer) const {
  printer->Print(
      variables_,
      "private static final class $capitalized_name$DefaultEntryHolder {\n"
      "  static final com.google.protobuf.MapEntryLite<\n"
      "      $type_parameters$> defaultEntry =\n"
      "          com.google.protobuf.MapEntryLite\n"
      "          .<$type_parameters$>newDefaultInstance(\n"
      "              $key_wire_type$,\n"
      "              $key_default_value$,\n"
      "              $value_wire_type$,\n"
      "              $value_default_value$);\n"
      "}\n");
  printer->Print(
      variables_,
      "private com.google.protobuf.MapFieldLite<\n"
      "    $type_parameters$> $name$_ =\n"
      "        com.google.protobuf.MapFieldLite.emptyMapField();\n"
      "private com.google.protobuf.MapFieldLite<$type_parameters$>\n"
      "internalGet$capitalized_name$() {\n"
      "  return $name$_;\n"
      "}\n"
      "private com.google.protobuf.MapFieldLite<$type_parameters$>\n"
      "internalGetMutable$capitalized_name$() {\n"
      "  if (!$name$_.isMutable()) {\n"
      "    $name$_ = $name$_.mutableCopy();\n"
      "  }\n"
      "  return $name$_;\n"
      "}\n");
  printer->Print(
      variables_,
      "$deprecation$\n"
      "public int get$capitalized_name$Count() {\n"
      "  return internalGet$capitalized_name$().size();\n"
      "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(
      variables_,
      "$deprecation$\n"
      "public boolean contains$capitalized_name$(\n"
      "    $key_type$ key) {\n"
      "  $key_null_check$\n"
      "  return internalGet$capitalized_name$().containsKey(key);\n"
      "}\n");
  if (GetJavaType(ValueField(descriptor_)) == JAVATYPE_ENUM) {
    printer->Print(
        variables_,
        "private static final\n"
        "com.google.protobuf.Internal.MapAdapter.Converter<\n"
        "    java.lang.Integer, $value_enum_type$> $name$ValueConverter =\n"
        "        com.google.protobuf.Internal.MapAdapter.newEnumConverter(\n"
        "            $value_enum_type$.internalGetValueMap(),\n"
        "            $unrecognized_value$);\n");
    printer->Print(
        variables_,
        "/**\n"
        " * Use {@link #get$capitalized_name$Map()} instead.\n"
        " */\n"
        "@java.lang.Deprecated\n"
        "public java.util.Map<$boxed_key_type$, $value_enum_type$>\n"
        "get$capitalized_name$() {\n"
        "  return get$capitalized_name$Map();\n"
        "}\n");
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(
        variables_,
        "$deprecation$\n"
        "public java.util.Map<$boxed_key_type$, $value_enum_type$>\n"
        "get$capitalized_name$Map() {\n"
        "  return java.util.Collections.unmodifiableMap(\n"
        "      new com.google.protobuf.Internal.MapAdapter<\n"
        "        $boxed_key_type$, $value_enum_type$, java.lang.Integer>(\n"
        "            internalGet$capitalized_name$(),\n"
        "            $name$ValueConverter));\n"
        "}\n");
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(
        variables_,
        "$deprecation$\n"
        "public $value_enum_type$ get$capitalized_name$OrDefault(\n"
        "    $key_type$ key,\n"
        "    $value_enum_type$ defaultValue) {\n"
        "  $key_null_check$\n"
        "  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n"
        "      internalGet$capitalized_name$();\n"
        "  return map.containsKey(key)\n"
        "         ? $name$ValueConverter.doForward(map.get(key))\n"
        "         : defaultValue;\n"
        "}\n");
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(
        variables_,
        "$deprecation$\n"
        "public $value_enum_type$ get$capitalized_name$OrThrow(\n"
        "    $key_type$ key) {\n"
        "  $key_null_check$\n"
        "  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n"
        "      internalGet$capitalized_name$();\n"
        "  if (!map.containsKey(key)) {\n"
        "    throw new java.lang.IllegalArgumentException();\n"
        "  }\n"
        "  return $name$ValueConverter.doForward(map.get(key));\n"
        "}\n");
    if (SupportUnknownEnumValue(descriptor_->file())) {
      printer->Print(
          variables_,
          "/**\n"
          " * Use {@link #get$capitalized_name$ValueMap()} instead.\n"
          " */\n"
          "@java.lang.Deprecated\n"
          "public java.util.Map<$boxed_key_type$, $boxed_value_type$>\n"
          "get$capitalized_name$Value() {\n"
          "  return get$capitalized_name$ValueMap();\n"
          "}\n");
      WriteFieldDocComment(printer, descriptor_);
      printer->Print(
          variables_,
          "$deprecation$\n"
          "public java.util.Map<$boxed_key_type$, $boxed_value_type$>\n"
          "get$capitalized_name$ValueMap() {\n"
          "  return java.util.Collections.unmodifiableMap(\n"
          "      internalGet$capitalized_name$());\n"
          "}\n");
      WriteFieldDocComment(printer, descriptor_);
      printer->Print(
          variables_,
          "$deprecation$\n"
          "public $value_type$ get$capitalized_name$ValueOrDefault(\n"
          "    $key_type$ key,\n"
          "    $value_type$ defaultValue) {\n"
          "  $key_null_check$\n"
          "  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n"
          "      internalGet$capitalized_name$();\n"
          "  return map.containsKey(key) ? map.get(key) : defaultValue;\n"
          "}\n");
      WriteFieldDocComment(printer, descriptor_);
      printer->Print(
          variables_,
          "$deprecation$\n"
          "public $value_type$ get$capitalized_name$ValueOrThrow(\n"
          "    $key_type$ key) {\n"
          "  $key_null_check$\n"
          "  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n"
          "      internalGet$capitalized_name$();\n"
          "  if (!map.containsKey(key)) {\n"
          "    throw new java.lang.IllegalArgumentException();\n"
          "  }\n"
          "  return map.get(key);\n"
          "}\n");
    }
  } else {
    printer->Print(
        variables_,
        "/**\n"
        " * Use {@link #get$capitalized_name$Map()} instead.\n"
        " */\n"
        "@java.lang.Deprecated\n"
        "public java.util.Map<$type_parameters$> get$capitalized_name$() {\n"
        "  return get$capitalized_name$Map();\n"
        "}\n");
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(
        variables_,
        "$deprecation$\n"
        "public java.util.Map<$type_parameters$> get$capitalized_name$Map() {\n"
        "  return java.util.Collections.unmodifiableMap(\n"
        "      internalGet$capitalized_name$());\n"
        "}\n");
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(
        variables_,
        "$deprecation$\n"
        "public $value_type$ get$capitalized_name$OrDefault(\n"
        "    $key_type$ key,\n"
        "    $value_type$ defaultValue) {\n"
        "  $key_null_check$\n"
        "  java.util.Map<$type_parameters$> map =\n"
        "      internalGet$capitalized_name$();\n"
        "  return map.containsKey(key) ? map.get(key) : defaultValue;\n"
        "}\n");
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(
        variables_,
        "$deprecation$\n"
        "public $value_type$ get$capitalized_name$OrThrow(\n"
        "    $key_type$ key) {\n"
        "  $key_null_check$\n"
        "  java.util.Map<$type_parameters$> map =\n"
        "      internalGet$capitalized_name$();\n"
        "  if (!map.containsKey(key)) {\n"
        "    throw new java.lang.IllegalArgumentException();\n"
        "  }\n"
        "  return map.get(key);\n"
        "}\n");
  }

  // Generate private setters for the builder to proxy into.
  if (GetJavaType(ValueField(descriptor_)) == JAVATYPE_ENUM) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(
        variables_,
        "private java.util.Map<$boxed_key_type$, $value_enum_type$>\n"
        "getMutable$capitalized_name$Map() {\n"
        "  return new com.google.protobuf.Internal.MapAdapter<\n"
        "      $boxed_key_type$, $value_enum_type$, java.lang.Integer>(\n"
        "          internalGetMutable$capitalized_name$(),\n"
        "          $name$ValueConverter);\n"
        "}\n");
    if (SupportUnknownEnumValue(descriptor_->file())) {
      WriteFieldDocComment(printer, descriptor_);
      printer->Print(
          variables_,
          "private java.util.Map<$boxed_key_type$, $boxed_value_type$>\n"
          "getMutable$capitalized_name$ValueMap() {\n"
          "  return internalGetMutable$capitalized_name$();\n"
          "}\n");
    }
  } else {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(
        variables_,
        "private java.util.Map<$type_parameters$>\n"
        "getMutable$capitalized_name$Map() {\n"
        "  return internalGetMutable$capitalized_name$();\n"
        "}\n");
  }
}